

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

int run_test_poll_nested_epoll(void)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  undefined1 *puVar6;
  connection_context_t *pcVar7;
  void *pvVar8;
  ssize_t sVar9;
  int *piVar10;
  uint extraout_EDX;
  uint uVar11;
  ulong unaff_RBX;
  undefined1 *in_RSI;
  undefined1 *puVar12;
  sockaddr *__addr;
  void *pvVar13;
  undefined1 *puVar14;
  long *plVar15;
  long *plVar16;
  long *plVar17;
  undefined8 *__ptr;
  ulong uVar18;
  size_t sVar19;
  uv_poll_t poll_handle;
  socklen_t sStack_ec;
  sockaddr sStack_e8;
  code *pcStack_d8;
  undefined4 uStack_c4;
  undefined1 *puStack_c0;
  undefined1 *puStack_b8;
  code *pcStack_b0;
  undefined1 auStack_a8 [160];
  
  puVar12 = auStack_a8;
  puVar6 = auStack_a8;
  puVar14 = (undefined1 *)0x1;
  pcStack_b0 = (code *)0x173d0f;
  uVar3 = epoll_create(1);
  if (uVar3 == 0xffffffff) {
    pcStack_b0 = (code *)0x173dd7;
    run_test_poll_nested_epoll_cold_7();
LAB_00173dd7:
    puVar6 = puVar14;
    pcStack_b0 = (code *)0x173ddc;
    run_test_poll_nested_epoll_cold_1();
LAB_00173ddc:
    pcStack_b0 = (code *)0x173de1;
    run_test_poll_nested_epoll_cold_2();
LAB_00173de1:
    pcStack_b0 = (code *)0x173de6;
    run_test_poll_nested_epoll_cold_6();
LAB_00173de6:
    pcStack_b0 = (code *)0x173deb;
    run_test_poll_nested_epoll_cold_3();
LAB_00173deb:
    pcStack_b0 = (code *)0x173df0;
    run_test_poll_nested_epoll_cold_4();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    pcStack_b0 = (code *)0x173d1f;
    puVar14 = (undefined1 *)uv_default_loop();
    pcStack_b0 = (code *)0x173d2c;
    iVar4 = uv_poll_init(puVar14,auStack_a8,unaff_RBX);
    in_RSI = puVar12;
    if (iVar4 != 0) goto LAB_00173dd7;
    in_RSI = (undefined1 *)0x1;
    pcStack_b0 = (code *)0x173d48;
    iVar4 = uv_poll_start(auStack_a8,1,abort);
    if (iVar4 != 0) goto LAB_00173ddc;
    pcStack_b0 = (code *)0x173d55;
    puVar6 = (undefined1 *)uv_default_loop();
    in_RSI = (undefined1 *)0x2;
    pcStack_b0 = (code *)0x173d62;
    iVar4 = uv_run();
    if (iVar4 == 0) goto LAB_00173de1;
    pcStack_b0 = (code *)0x173d70;
    uv_close(auStack_a8);
    pcStack_b0 = (code *)0x173d75;
    puVar6 = (undefined1 *)uv_default_loop();
    in_RSI = (undefined1 *)0x0;
    pcStack_b0 = (code *)0x173d7f;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_00173de6;
    puVar6 = (undefined1 *)(ulong)uVar3;
    pcStack_b0 = (code *)0x173d8a;
    iVar4 = close(uVar3);
    if (iVar4 != 0) goto LAB_00173deb;
    pcStack_b0 = (code *)0x173d93;
    unaff_RBX = uv_default_loop();
    pcStack_b0 = (code *)0x173da7;
    uv_walk(unaff_RBX,close_walk_cb,0);
    in_RSI = (undefined1 *)0x0;
    pcStack_b0 = (code *)0x173db1;
    uv_run(unaff_RBX);
    pcStack_b0 = (code *)0x173db6;
    puVar6 = (undefined1 *)uv_default_loop();
    pcStack_b0 = (code *)0x173dbe;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_b0 = (code *)0x173dc7;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_b0 = create_bound_socket;
  run_test_poll_nested_epoll_cold_5();
  plVar15 = (long *)0x2;
  pcStack_d8 = (code *)0x173e15;
  puStack_c0 = puVar6;
  puStack_b8 = in_RSI;
  pcStack_b0 = (code *)unaff_RBX;
  uVar3 = socket(2,1,0);
  if ((int)uVar3 < 0) {
    pcStack_d8 = (code *)0x173e63;
    create_bound_socket_cold_1();
LAB_00173e63:
    pcStack_d8 = (code *)0x173e68;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar3;
    uStack_c4 = 1;
    plVar15 = (long *)(ulong)uVar3;
    pcStack_d8 = (code *)0x173e3d;
    iVar4 = setsockopt(uVar3,1,2,&uStack_c4,4);
    if (iVar4 != 0) goto LAB_00173e63;
    plVar15 = (long *)(ulong)uVar3;
    pcStack_d8 = (code *)0x173e52;
    iVar4 = bind(uVar3,(sockaddr *)&puStack_c0,0x10);
    if (iVar4 == 0) {
      return uVar3;
    }
  }
  pcStack_d8 = server_poll_cb;
  create_bound_socket_cold_3();
  lVar1 = *plVar15;
  sStack_ec = 0x10;
  pcVar7 = (connection_context_t *)(ulong)*(uint *)(lVar1 + 0xa0);
  __addr = &sStack_e8;
  pcStack_d8 = (code *)unaff_RBX;
  iVar4 = accept(*(uint *)(lVar1 + 0xa0),__addr,&sStack_ec);
  iVar5 = (int)__addr;
  if (iVar4 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    pcVar7 = create_connection_context(iVar4,1);
    pcVar7->events = 7;
    iVar5 = 7;
    iVar4 = uv_poll_start(pcVar7,7,connection_poll_cb);
    if (iVar4 == 0) {
      iVar4 = *(int *)(lVar1 + 0xa4) + 1;
      *(int *)(lVar1 + 0xa4) = iVar4;
      if (iVar4 == 5) {
        close_socket(*(uv_os_sock_t *)(lVar1 + 0xa0));
        iVar4 = uv_close(lVar1,server_close_cb);
      }
      return iVar4;
    }
  }
  server_poll_cb_cold_2();
  plVar15 = (long *)0x170;
  iVar4 = iVar5;
  pvVar8 = malloc(0x170);
  if (pvVar8 == (void *)0x0) {
    create_connection_context_cold_3();
LAB_00173f97:
    create_connection_context_cold_1();
  }
  else {
    *(int *)((long)pvVar8 + 0x138) = (int)pcVar7;
    *(int *)((long)pvVar8 + 0x150) = iVar5;
    *(undefined8 *)((long)pvVar8 + 0x140) = 0;
    *(undefined8 *)((long)pvVar8 + 0x148) = 0;
    *(undefined8 *)((long)pvVar8 + 0x154) = 0;
    *(undefined8 *)((long)pvVar8 + 0x15c) = 0;
    *(undefined8 *)((long)pvVar8 + 0x164) = 0;
    plVar15 = (long *)uv_default_loop();
    pvVar13 = pvVar8;
    iVar5 = uv_poll_init_socket(plVar15,pvVar8,(ulong)pcVar7 & 0xffffffff);
    iVar4 = (int)pvVar13;
    *(int *)((long)pvVar8 + 0x154) = *(int *)((long)pvVar8 + 0x154) + 1;
    *(void **)pvVar8 = pvVar8;
    if (iVar5 != 0) goto LAB_00173f97;
    plVar15 = (long *)uv_default_loop();
    iVar4 = (int)pvVar8 + 0xa0;
    iVar5 = uv_timer_init();
    *(int *)((long)pvVar8 + 0x154) = *(int *)((long)pvVar8 + 0x154) + 1;
    *(void **)((long)pvVar8 + 0xa0) = pvVar8;
    if (iVar5 == 0) {
      return (int)pvVar8;
    }
  }
  create_connection_context_cold_2();
  plVar16 = plVar15;
  if (iVar4 == 0) {
    plVar2 = (long *)*plVar15;
    uVar3 = *(uint *)((long)plVar2 + 0x164);
    if ((uVar3 & extraout_EDX) == 0) goto LAB_00174559;
    if ((~uVar3 & extraout_EDX) == 0) {
      if ((extraout_EDX & 1) != 0) goto LAB_001740f0;
switchD_00174131_caseD_4:
      if ((extraout_EDX & 2) != 0) {
        if (((ulong)plVar2[0x29] < 0x10000) &&
           ((test_mode != '\x01' || (*(int *)(plVar2 + 0x2a) == 0)))) {
          iVar4 = rand();
          switch(iVar4 % 7) {
          case 0:
          case 1:
            uVar18 = -(plVar2[0x29] + -0x10000);
            sVar19 = 0x67;
            if (uVar18 < 0x67) {
              sVar19 = uVar18;
            }
            if (plVar2[0x29] == 0x10000) goto LAB_00174577;
            do {
              plVar16 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
              sVar9 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_2,sVar19,0);
              uVar11 = (uint)sVar9;
              if (uVar11 != 0xffffffff) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            if ((int)uVar11 < 0) {
              piVar10 = __errno_location();
              if ((*piVar10 != 0xb) && (*piVar10 != 0x73)) {
                connection_poll_cb_cold_13();
                goto LAB_001744e3;
              }
LAB_001744fc:
              spurious_writable_wakeups = spurious_writable_wakeups + 1;
            }
            else {
              if (uVar11 == 0) goto LAB_00174581;
              plVar2[0x29] = plVar2[0x29] + (ulong)(uVar11 & 0x7fffffff);
              valid_writable_wakeups = valid_writable_wakeups + 1;
            }
            break;
          case 2:
          case 3:
            sVar19 = -(plVar2[0x29] + -0x10000);
            if (0x4d1 < sVar19) {
              sVar19 = 0x4d2;
            }
            if (plVar2[0x29] == 0x10000) goto LAB_0017457c;
            do {
              plVar16 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
              sVar9 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_3,sVar19,0);
              uVar11 = (uint)sVar9;
              if (uVar11 != 0xffffffff) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            if ((int)uVar11 < 0) {
LAB_001744e3:
              piVar10 = __errno_location();
              if ((*piVar10 == 0xb) || (*piVar10 == 0x73)) goto LAB_001744fc;
              goto LAB_00174590;
            }
            if (uVar11 == 0) goto LAB_00174586;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar18 = (ulong)(uVar11 & 0x7fffffff) + plVar2[0x29];
            plVar2[0x29] = uVar18;
            while (uVar18 < 0x10000) {
              sVar19 = 0x10000 - uVar18;
              if (uVar18 < 0xfb2f) {
                sVar19 = 0x4d2;
              }
              do {
                plVar16 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
                sVar9 = send(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_3,sVar19,0);
                uVar11 = (uint)sVar9;
                if (uVar11 != 0xffffffff) break;
                piVar10 = __errno_location();
              } while (*piVar10 == 4);
              if (uVar11 == 0) {
LAB_0017454f:
                connection_poll_cb_cold_7();
                goto LAB_00174554;
              }
              if ((int)uVar11 < 0) {
                piVar10 = __errno_location();
                if ((*piVar10 != 0xb) && (*piVar10 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_0017454f;
                }
                break;
              }
              uVar18 = (ulong)(uVar11 & 0x7fffffff) + plVar2[0x29];
              plVar2[0x29] = uVar18;
            }
            break;
          case 4:
            break;
          case 5:
            uVar3 = uVar3 & 0xfffffffd;
            iVar4 = uv_is_active(plVar2 + 0x14);
            if (iVar4 == 0) {
              *(undefined4 *)(plVar2 + 0x2d) = 2;
              uv_timer_start(plVar2 + 0x14,delay_timer_cb,100,0);
            }
            else {
              *(byte *)(plVar2 + 0x2d) = *(byte *)(plVar2 + 0x2d) | 2;
            }
            break;
          case 6:
            uv_poll_start(plVar2,1,connection_poll_cb);
            uv_poll_start(plVar2,2,connection_poll_cb);
            *(undefined4 *)((long)plVar2 + 0x164) = 2;
            break;
          default:
            goto switchD_001741dd_default;
          }
        }
        else {
          plVar16 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
          iVar4 = shutdown(*(uint *)(plVar2 + 0x27),1);
          if (iVar4 != 0) goto LAB_00174568;
          *(undefined4 *)((long)plVar2 + 0x15c) = 1;
          uVar3 = uVar3 & 0xfffffffd;
        }
      }
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(plVar2 + 0x2c) = 1;
        disconnects = disconnects + 1;
        uVar3 = uVar3 & 0xfffffffb;
      }
      if (((*(int *)(plVar2 + 0x2b) == 0) || (*(int *)((long)plVar2 + 0x15c) == 0)) ||
         (*(int *)(plVar2 + 0x2c) == 0)) {
        if (uVar3 != *(uint *)((long)plVar2 + 0x164)) {
          *(uint *)((long)plVar2 + 0x164) = uVar3;
          uv_poll_start(plVar15,uVar3,connection_poll_cb);
        }
      }
      else {
        close_socket(*(uv_os_sock_t *)(plVar2 + 0x27));
        uv_close(plVar2,connection_close_cb);
        uv_close(plVar2 + 0x14,connection_close_cb);
        *(undefined4 *)((long)plVar2 + 0x164) = 0;
      }
      iVar4 = *(int *)((long)plVar2 + 0x164);
      plVar16 = plVar15;
      iVar5 = uv_is_active();
      if (iVar4 == 0) {
        if (iVar5 == 0) {
          return iVar5;
        }
        goto LAB_00174563;
      }
      if (iVar5 == 1) {
        return iVar5;
      }
      connection_poll_cb_cold_16();
LAB_001740f0:
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        do {
          plVar16 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
          sVar9 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer,0x4a,0);
          uVar11 = (uint)sVar9;
          if (uVar11 != 0xffffffff) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        if ((int)uVar11 < 0) goto LAB_0017456d;
        if (uVar11 == 0) goto LAB_001742c7;
        plVar2[0x28] = plVar2[0x28] + (ulong)(uVar11 & 0x7fffffff);
        goto switchD_00174131_caseD_4;
      case 2:
      case 3:
LAB_0017426c:
        plVar16 = (long *)(ulong)*(uint *)(plVar2 + 0x27);
        sVar9 = recv(*(uint *)(plVar2 + 0x27),connection_poll_cb::buffer_1,0x3a3,0);
        uVar11 = (uint)sVar9;
        if (uVar11 == 0xffffffff) goto code_r0x0017428a;
        goto LAB_00174294;
      case 4:
        goto switchD_00174131_caseD_4;
      case 5:
        uVar3 = uVar3 & 0xfffffffe;
        plVar16 = plVar2 + 0x14;
        plVar17 = plVar16;
        iVar4 = uv_is_active();
        if (iVar4 == 0) {
          *(undefined4 *)(plVar2 + 0x2d) = 1;
          uv_timer_start(plVar16,delay_timer_cb,10,0);
        }
        else {
          *(byte *)(plVar2 + 0x2d) = *(byte *)(plVar2 + 0x2d) | 1;
          plVar16 = plVar17;
        }
        goto switchD_00174131_caseD_4;
      case 6:
        uv_poll_start(plVar2,2,connection_poll_cb);
        plVar16 = plVar2;
        uv_poll_start(plVar2,1,connection_poll_cb);
        *(undefined4 *)((long)plVar2 + 0x164) = 1;
        goto switchD_00174131_caseD_4;
      default:
        goto switchD_00174131_default;
      }
    }
  }
  else {
LAB_00174554:
    connection_poll_cb_cold_1();
LAB_00174559:
    connection_poll_cb_cold_18();
  }
  connection_poll_cb_cold_2();
LAB_00174563:
  connection_poll_cb_cold_17();
LAB_00174568:
  connection_poll_cb_cold_6();
LAB_0017456d:
  connection_poll_cb_cold_4();
switchD_00174131_default:
  connection_poll_cb_cold_5();
LAB_00174577:
  connection_poll_cb_cold_14();
LAB_0017457c:
  connection_poll_cb_cold_11();
LAB_00174581:
  connection_poll_cb_cold_12();
LAB_00174586:
  connection_poll_cb_cold_9();
switchD_001741dd_default:
  connection_poll_cb_cold_15();
LAB_00174590:
  connection_poll_cb_cold_10();
  iVar4 = close((int)plVar16);
  if ((iVar4 == 0) || (piVar10 = __errno_location(), *piVar10 == 0x68)) {
    return extraout_EAX;
  }
  close_socket_cold_1();
  plVar15 = (long *)*plVar16;
  iVar4 = uv_is_active();
  if (iVar4 == 0) {
    if (*(uint *)(plVar15 + 0x2d) == 0) goto LAB_001745f7;
    uVar3 = *(uint *)(plVar15 + 0x2d) | *(uint *)((long)plVar15 + 0x164);
    *(uint *)((long)plVar15 + 0x164) = uVar3;
    *(undefined4 *)(plVar15 + 0x2d) = 0;
    iVar4 = uv_poll_start(plVar15,uVar3,connection_poll_cb);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_001745f7:
    plVar15 = plVar16;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)*plVar15;
  piVar10 = (int *)((long)__ptr + 0x154);
  *piVar10 = *piVar10 + -1;
  if (*piVar10 != 0) {
    return extraout_EAX_00;
  }
  if ((test_mode == '\x01') && (*(int *)(__ptr + 0x2a) == 0)) {
    if (__ptr[0x28] != 0) {
      connection_close_cb_cold_2();
LAB_00174673:
      connection_close_cb_cold_1();
      goto LAB_00174678;
    }
  }
  else if (__ptr[0x28] != 0x10000) goto LAB_00174673;
  if ((test_mode != '\0') && (*(int *)(__ptr + 0x2a) != 0)) {
    if (__ptr[0x29] == 0) goto LAB_00174658;
    connection_close_cb_cold_3();
  }
  if (__ptr[0x29] != 0x10000) {
LAB_00174678:
    connection_close_cb_cold_4();
    free((void *)*__ptr);
    return extraout_EAX_02;
  }
LAB_00174658:
  closed_connections = closed_connections + 1;
  free(__ptr);
  return extraout_EAX_01;
code_r0x0017428a:
  piVar10 = __errno_location();
  if (*piVar10 == 4) goto LAB_0017426c;
LAB_00174294:
  if (0 < (int)uVar11) {
    plVar2[0x28] = plVar2[0x28] + (ulong)(uVar11 & 0x7fffffff);
    goto LAB_0017426c;
  }
  if (uVar11 != 0) {
    piVar10 = __errno_location();
    if ((*piVar10 == 0xb) || (*piVar10 == 0x73)) goto switchD_00174131_caseD_4;
    connection_poll_cb_cold_3();
  }
LAB_001742c7:
  *(undefined4 *)(plVar2 + 0x2b) = 1;
  uVar3 = uVar3 & 0xfffffffe;
  goto switchD_00174131_caseD_4;
}

Assistant:

TEST_IMPL(poll_nested_epoll) {
  uv_poll_t poll_handle;
  int fd;

  fd = epoll_create(1);
  ASSERT(fd != -1);

  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, (uv_poll_cb) abort));
  ASSERT(0 != uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  uv_close((uv_handle_t*) &poll_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == close(fd));

  MAKE_VALGRIND_HAPPY();
  return 0;
}